

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestRunNode::~TestRunNode(TestRunNode *this)

{
  ~TestRunNode(this);
  operator_delete(this);
  return;
}

Assistant:

TestRunNode::~TestRunNode() {}